

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O0

int rtosc_arg_val_to_int(rtosc_arg_val_t *av,int *res)

{
  int *res_local;
  rtosc_arg_val_t *av_local;
  int local_4;
  
  switch(av->type) {
  case 'F':
  case 'T':
    *res = (int)(av->val).T;
    local_4 = 1;
    break;
  default:
    local_4 = 0;
    break;
  case 'c':
  case 'i':
    *res = (av->val).i;
    local_4 = 1;
    break;
  case 'd':
    *res = (int)(av->val).d;
    local_4 = 1;
    break;
  case 'f':
    *res = (int)(av->val).f;
    local_4 = 1;
    break;
  case 'h':
    *res = (int)(av->val).h;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int rtosc_arg_val_to_int(const rtosc_arg_val_t* av, int* res)
{
    switch(av->type)
    {
        case 'd': *res = av->val.d; return true;
        case 'f': *res = av->val.f; return true;
        case 'h': *res = av->val.h; return true;
        case 'c':
        case 'i': *res = av->val.i; return true;
        case 'T':
        case 'F':
            *res = av->val.T; return true;
        default: return false;
    }
}